

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv4Transmitter::LeaveAllMulticastGroups(RTPUDPv4Transmitter *this)

{
  uint32_t __hostlong;
  bool bVar1;
  uint *puVar2;
  uint32_t local_28;
  uint32_t local_24;
  ip_mreq mreq_1;
  ip_mreq mreq;
  int status;
  uint32_t mcastIP;
  RTPUDPv4Transmitter *this_local;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
    GotoFirstElement(&this->multicastgroups);
    while (bVar1 = RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
                   ::HasCurrentElement(&this->multicastgroups), bVar1) {
      puVar2 = RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
               ::GetCurrentElement(&this->multicastgroups);
      __hostlong = *puVar2;
      mreq_1.imr_multiaddr.s_addr = htonl(__hostlong);
      mreq_1.imr_interface.s_addr = htonl(this->mcastifaceIP);
      setsockopt(this->rtpsock,0,0x24,&mreq_1,8);
      if (this->rtpsock != this->rtcpsock) {
        local_28 = htonl(__hostlong);
        local_24 = htonl(this->mcastifaceIP);
        setsockopt(this->rtcpsock,0,0x24,&local_28,8);
      }
      RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
      GotoNextElement(&this->multicastgroups);
    }
    RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::Clear
              (&this->multicastgroups);
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::LeaveAllMulticastGroups()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
	{
		multicastgroups.GotoFirstElement();
		while (multicastgroups.HasCurrentElement())
		{
			uint32_t mcastIP;
			int status = 0;

			mcastIP = multicastgroups.GetCurrentElement();
			
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
			if (rtpsock != rtcpsock) // no need to leave multicast group twice when multiplexing
				RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
			JRTPLIB_UNUSED(status);

			multicastgroups.GotoNextElement();
		}
		multicastgroups.Clear();
	}
	MAINMUTEX_UNLOCK
}